

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

int GetSpriteIndex(char *spritename,bool add)

{
  int iVar1;
  spritedef_t *__s1;
  ulong uVar2;
  int i;
  ulong uVar3;
  char upper [5];
  spritedef_t temp;
  
  upper[4] = '\0';
  upper[0] = '\0';
  upper[1] = '\0';
  upper[2] = '\0';
  upper[3] = '\0';
  for (uVar3 = 0; (uVar3 < 4 && (spritename[uVar3] != '\0')); uVar3 = uVar3 + 1) {
    iVar1 = toupper((int)spritename[uVar3]);
    upper[uVar3] = (char)iVar1;
  }
  iVar1 = strcmp(upper,GetSpriteIndex::lastsprite);
  if (iVar1 == 0) {
    uVar3 = (ulong)(uint)GetSpriteIndex::lastindex;
  }
  else {
    strcpy(GetSpriteIndex::lastsprite,upper);
    uVar2 = (ulong)sprites.Count;
    __s1 = sprites.Array;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = strcmp((char *)__s1,upper);
      if (iVar1 == 0) {
        GetSpriteIndex::lastindex = (int)uVar3;
        goto LAB_0046707f;
      }
      __s1 = __s1 + 1;
    }
    if (add) {
      strcpy((char *)&temp,upper);
      temp.numframes = '\0';
      temp.spriteframes = 0;
      GetSpriteIndex::lastindex = TArray<spritedef_t,_spritedef_t>::Push(&sprites,&temp);
      uVar3 = (ulong)(uint)GetSpriteIndex::lastindex;
    }
    else {
      GetSpriteIndex::lastindex = -1;
      uVar3 = 0xffffffffffffffff;
    }
  }
LAB_0046707f:
  return (int)uVar3;
}

Assistant:

int GetSpriteIndex(const char * spritename, bool add)
{
	static char lastsprite[5];
	static int lastindex;

	// Make sure that the string is upper case and 4 characters long
	char upper[5]={0,0,0,0,0};
	for (int i = 0; spritename[i] != 0 && i < 4; i++)
	{
		upper[i] = toupper (spritename[i]);
	}

	// cache the name so if the next one is the same the function doesn't have to perform a search.
	if (!strcmp(upper, lastsprite))
	{
		return lastindex;
	}
	strcpy(lastsprite, upper);

	for (unsigned i = 0; i < sprites.Size (); ++i)
	{
		if (strcmp (sprites[i].name, upper) == 0)
		{
			return (lastindex = (int)i);
		}
	}
	if (!add)
	{
		return (lastindex = -1);
	}
	spritedef_t temp;
	strcpy (temp.name, upper);
	temp.numframes = 0;
	temp.spriteframes = 0;
	return (lastindex = (int)sprites.Push (temp));
}